

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kfindxx.cpp
# Opt level: O2

void parse_args(int argc,char **argv,int *min,int *max)

{
  long lVar1;
  undefined8 extraout_RAX;
  string sStack_c8;
  char **local_a8;
  string arg;
  allocator<char> local_70 [64];
  
  if (argc < 2) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,argv[1],(allocator<char> *)&sStack_c8);
  local_a8 = argv;
  lVar1 = std::__cxx11::string::find((char)&arg,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_c8,"expected 3 dots (got 0)",local_70);
    abort_parsing(local_a8,&sStack_c8);
  }
  else {
    lVar1 = std::__cxx11::string::find((char)&arg,0x2e);
    if (lVar1 != -1) {
      lVar1 = std::__cxx11::string::find((char)&arg,0x2e);
      if (lVar1 != -1) {
        std::__cxx11::string::substr((ulong)&sStack_c8,(ulong)&arg);
        parse_range(min,max,&sStack_c8);
        std::__cxx11::string::~string((string *)&sStack_c8);
        std::__cxx11::string::substr((ulong)&sStack_c8,(ulong)&arg);
        parse_range(min + 1,max + 1,&sStack_c8);
        std::__cxx11::string::~string((string *)&sStack_c8);
        std::__cxx11::string::substr((ulong)&sStack_c8,(ulong)&arg);
        parse_range(min + 2,max + 2,&sStack_c8);
        std::__cxx11::string::~string((string *)&sStack_c8);
        std::__cxx11::string::substr((ulong)&sStack_c8,(ulong)&arg);
        parse_range(min + 3,max + 3,&sStack_c8);
        std::__cxx11::string::~string((string *)&sStack_c8);
        std::__cxx11::string::~string((string *)&arg);
        return;
      }
      goto LAB_001027a8;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_c8,"expected 3 dots (got 1)",local_70);
  abort_parsing(local_a8,&sStack_c8);
LAB_001027a8:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_c8,"expected 3 dots (got 2)",local_70);
  abort_parsing(local_a8,&sStack_c8);
  std::__cxx11::string::~string((string *)&sStack_c8);
  std::__cxx11::string::~string((string *)&arg);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
parse_args(int argc, char *argv[], int min[4], int max[4])
{
    if (argc < 2) {
        return;
    }

    std::string arg{argv[1]};
    std::size_t pos[4];

    pos[0] = arg.find('.');
    if (pos[0] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 0)");
        return;
    }

    pos[1] = arg.find('.', pos[0] + 1);
    if (pos[1] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 1)");
        return;
    }

    pos[2] = arg.find('.', pos[1] + 1);
    if (pos[2] == std::string::npos) {
        abort_parsing(argv, "expected 3 dots (got 2)");
        return;
    }

    pos[3] = arg.size();

    int component_no = 1;
    try {
        parse_range(min[0], max[0], arg.substr(0, pos[0]));
        ++component_no;

        parse_range(min[1], max[1], arg.substr(pos[0] + 1, pos[1] - pos[0] - 1));
        ++component_no;

        parse_range(min[2], max[2], arg.substr(pos[1] + 1, pos[2] - pos[1] - 1));
        ++component_no;

        parse_range(min[3], max[3], arg.substr(pos[2] + 1, pos[3] - pos[2] - 1));
    } catch (const std::invalid_argument&) {
        abort_parsing(argv, "invalid range specified (component " + std::to_string(component_no) + ")");
    }
}